

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

void __thiscall
QEventDispatcherGlib::unregisterSocketNotifier(QEventDispatcherGlib *this,QSocketNotifier *notifier)

{
  long lVar1;
  long lVar2;
  void *pvVar3;
  qsizetype i;
  long i_00;
  
  lVar1 = *(long *)(this + 8);
  lVar2 = *(long *)(lVar1 + 0xa8);
  i_00 = 0;
  while( true ) {
    if (*(long *)(lVar2 + 0x70) == i_00) {
      return;
    }
    pvVar3 = *(void **)(*(long *)(lVar2 + 0x68) + i_00 * 8);
    if (*(QSocketNotifier **)((long)pvVar3 + 8) == notifier) break;
    i_00 = i_00 + 1;
  }
  g_source_remove_poll(lVar2,pvVar3);
  QList<GPollFDWithQSocketNotifier_*>::removeAt
            ((QList<GPollFDWithQSocketNotifier_*> *)(*(long *)(lVar1 + 0xa8) + 0x60),i_00);
  operator_delete(pvVar3,0x10);
  lVar2 = *(long *)(*(long *)(lVar1 + 0xa8) + 0x78);
  if (lVar2 < i_00) {
    return;
  }
  *(long *)(*(long *)(lVar1 + 0xa8) + 0x78) = lVar2 + -1;
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }